

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b52ba8::ObmcSadHBDTest_RandomValues_Test::TestBody
          (ObmcSadHBDTest_RandomValues_Test *this)

{
  ACMRandom *this_00;
  undefined8 *puVar1;
  uchar *puVar2;
  ObmcSadHBDTest_RandomValues_Test *pOVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  SEARCH_METHODS *message;
  int i;
  long lVar9;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t pre [16384];
  int32_t wsrc [16384];
  int32_t mask [16384];
  AssertHelper AStack_280b0;
  Message MStack_280a8;
  uint uStack_280a0;
  uint uStack_2809c;
  internal aiStack_28098 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uStack_28090;
  undefined2 uStack_28088;
  uchar *puStack_28078;
  ObmcSadHBDTest_RandomValues_Test *pOStack_28070;
  ulong uStack_28068;
  undefined2 auStack_28060 [16384];
  int aiStack_20060 [16384];
  uint32_t auStack_10060 [16396];
  
  this_00 = &(this->super_ObmcSadHBDTest).
             super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
             .rng_;
  puStack_28078 = (uchar *)((ulong)auStack_28060 >> 1);
  uVar8 = 0;
  pOStack_28070 = this;
  while( true ) {
    if ((int)uVar8 == 1000) {
      return;
    }
    bVar4 = testing::Test::HasFatalFailure();
    if (bVar4) break;
    uStack_28068 = uVar8;
    uVar5 = testing::internal::Random::Generate(&this_00->random_,0x81);
    for (lVar9 = 0; pOVar3 = pOStack_28070, puVar2 = puStack_28078, lVar9 != 0x4000;
        lVar9 = lVar9 + 1) {
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x1000);
      auStack_28060[lVar9] = (short)uVar6;
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x1000);
      uVar7 = testing::internal::Random::Generate(&this_00->random_,0x1001);
      aiStack_20060[lVar9] = uVar7 * uVar6;
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x1001);
      auStack_10060[lVar9] = uVar6;
    }
    uStack_2809c = (*(pOStack_28070->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.ref_func)(puStack_28078,uVar5,aiStack_20060,(int *)auStack_10060);
    aiStack_28098[0] = SUB21(in_FPUControlWord,0);
    uStack_28090._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = (undefined4)in_FPUInstructionPointer;
    uStack_28088 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_28090._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_2_ = in_FPUTagWord;
    uStack_280a0 = (*(pOVar3->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.tst_func)(puVar2,uVar5,aiStack_20060,(int *)auStack_10060);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)aiStack_28098);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_28098,"ref_res","tst_res",&uStack_2809c,&uStack_280a0);
    uVar8 = uStack_28068;
    if (aiStack_28098[0] == (internal)0x0) {
      testing::Message::Message(&MStack_280a8);
      puVar1 = (undefined8 *)
               CONCAT44(uStack_28090._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,
                        CONCAT22(uStack_28090._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._2_2_,
                                 uStack_28090._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_2_));
      if (puVar1 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_280b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_sad_test.cc"
                 ,0xd2,(char *)message);
      testing::internal::AssertHelper::operator=(&AStack_280b0,&MStack_280a8);
      testing::internal::AssertHelper::~AssertHelper(&AStack_280b0);
      if (MStack_280a8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)MStack_280a8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&uStack_28090);
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&uStack_28090);
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  return;
}

Assistant:

TEST_P(ObmcSadHBDTest, RandomValues) {
  DECLARE_ALIGNED(32, uint16_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    const int pre_stride = rng_(MAX_SB_SIZE + 1);

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = rng_(1 << 12);
      wsrc[i] = rng_(1 << 12) * rng_(kMaskMax * kMaskMax + 1);
      mask[i] = rng_(kMaskMax * kMaskMax + 1);
    }

    const unsigned int ref_res =
        params_.ref_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res =
            params_.tst_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}